

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

void __thiscall
icu_63::Calendar::handleComputeFields(Calendar *this,int32_t param_1,UErrorCode *param_2)

{
  bool bVar1;
  int32_t iVar2;
  undefined4 local_28;
  undefined4 local_24;
  int32_t era;
  int32_t eyear;
  UErrorCode *param_2_local;
  int32_t param_1_local;
  Calendar *this_local;
  
  iVar2 = getGregorianMonth(this);
  internalSet(this,UCAL_MONTH,iVar2);
  iVar2 = getGregorianDayOfMonth(this);
  internalSet(this,UCAL_DATE,iVar2);
  iVar2 = getGregorianDayOfYear(this);
  internalSet(this,UCAL_DAY_OF_YEAR,iVar2);
  local_24 = getGregorianYear(this);
  internalSet(this,UCAL_EXTENDED_YEAR,local_24);
  bVar1 = local_24 < 1;
  if (bVar1) {
    local_24 = 1 - local_24;
  }
  local_28 = (uint)!bVar1;
  internalSet(this,UCAL_ERA,local_28);
  internalSet(this,UCAL_YEAR,local_24);
  return;
}

Assistant:

void Calendar::handleComputeFields(int32_t /* julianDay */, UErrorCode &/* status */)
{
    internalSet(UCAL_MONTH, getGregorianMonth());
    internalSet(UCAL_DAY_OF_MONTH, getGregorianDayOfMonth());
    internalSet(UCAL_DAY_OF_YEAR, getGregorianDayOfYear());
    int32_t eyear = getGregorianYear();
    internalSet(UCAL_EXTENDED_YEAR, eyear);
    int32_t era = GregorianCalendar::AD;
    if (eyear < 1) {
        era = GregorianCalendar::BC;
        eyear = 1 - eyear;
    }
    internalSet(UCAL_ERA, era);
    internalSet(UCAL_YEAR, eyear);
}